

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.h
# Opt level: O2

vbignum_t * __thiscall vbignum_t::operator%(vbignum_t *this,vbignum_t *b)

{
  vbignum_t *this_00;
  ushort uVar1;
  vbignum_t quo;
  
  this_00 = (vbignum_t *)operator_new(8);
  this_00->ext_ = (char *)0x0;
  quo.ext_ = (char *)0x0;
  uVar1 = *(ushort *)b->ext_;
  if (*(ushort *)b->ext_ < *(ushort *)this->ext_) {
    uVar1 = *(ushort *)this->ext_;
  }
  init(this_00,(EVP_PKEY_CTX *)(ulong)uVar1);
  init(&quo,(EVP_PKEY_CTX *)0x2);
  CVmObjBigNum::compute_quotient_into(quo.ext_,this_00->ext_,this->ext_,b->ext_);
  ~vbignum_t(&quo);
  return this_00;
}

Assistant:

vbignum_t *operator %(const vbignum_t &b) const
    {
        vbignum_t *res = new vbignum_t(), quo;
        res->init(maxprec(this, &b));
        quo.init(2);
        CVmObjBigNum::compute_quotient_into(quo.ext_, res->ext_, ext_, b.ext_);
        return res;
    }